

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

int alsa_stream_start(cubeb_stream_conflict1 *stm)

{
  cubeb_conflict1 *pcVar1;
  snd_pcm_state_t sVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  
  if (stm == (cubeb_stream_conflict1 *)0x0) {
    __assert_fail("stm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x502,"int alsa_stream_start(cubeb_stream *)");
  }
  pcVar1 = stm->context;
  if (((stm->stream_type == SND_PCM_STREAM_PLAYBACK) &&
      (stm->other_stream != (cubeb_stream_conflict1 *)0x0)) &&
     (iVar3 = alsa_stream_start(stm->other_stream), iVar3 != 0)) {
    return -1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&stm->mutex);
  if ((stm->stream_type == SND_PCM_STREAM_CAPTURE) &&
     (sVar2 = (*cubeb_snd_pcm_state)(stm->pcm), sVar2 == SND_PCM_STATE_PREPARED)) {
    (*cubeb_snd_pcm_start)(stm->pcm);
  }
  (*cubeb_snd_pcm_pause)(stm->pcm,0);
  gettimeofday((timeval *)&stm->last_activity,(__timezone_ptr_t)0x0);
  pthread_mutex_unlock((pthread_mutex_t *)&stm->mutex);
  __mutex = &pcVar1->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar3 = -1;
  if (stm->state == INACTIVE) {
    alsa_set_stream_state(stm,RUNNING);
    iVar3 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return iVar3;
}

Assistant:

static int
alsa_stream_start(cubeb_stream * stm)
{
  cubeb * ctx;

  assert(stm);
  ctx = stm->context;

  if (stm->stream_type == SND_PCM_STREAM_PLAYBACK && stm->other_stream) {
    int r = alsa_stream_start(stm->other_stream);
    if (r != CUBEB_OK)
      return r;
  }

  pthread_mutex_lock(&stm->mutex);
  /* Capture pcm must be started after initial setup/recover */
  if (stm->stream_type == SND_PCM_STREAM_CAPTURE &&
      WRAP(snd_pcm_state)(stm->pcm) == SND_PCM_STATE_PREPARED) {
    WRAP(snd_pcm_start)(stm->pcm);
  }
  WRAP(snd_pcm_pause)(stm->pcm, 0);
  gettimeofday(&stm->last_activity, NULL);
  pthread_mutex_unlock(&stm->mutex);

  pthread_mutex_lock(&ctx->mutex);
  if (stm->state != INACTIVE) {
    pthread_mutex_unlock(&ctx->mutex);
    return CUBEB_ERROR;
  }
  alsa_set_stream_state(stm, RUNNING);
  pthread_mutex_unlock(&ctx->mutex);

  return CUBEB_OK;
}